

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O3

ssh2_userkey * import_ssh2(Filename *filename,int type,char *passphrase,char **errmsg_p)

{
  LoadedFile *lf;
  ssh2_userkey *psVar1;
  
  lf = lf_load_keyfile(filename,errmsg_p);
  if (lf == (LoadedFile *)0x0) {
    psVar1 = (ssh2_userkey *)0x0;
  }
  else {
    psVar1 = import_ssh2_s(lf->binarysource_,type,passphrase,errmsg_p);
    lf_free(lf);
  }
  return psVar1;
}

Assistant:

ssh2_userkey *import_ssh2(const Filename *filename, int type,
                          char *passphrase, const char **errmsg_p)
{
    LoadedFile *lf = lf_load_keyfile(filename, errmsg_p);
    if (!lf)
        return false;

    ssh2_userkey *toret = import_ssh2_s(BinarySource_UPCAST(lf),
                                        type, passphrase, errmsg_p);
    lf_free(lf);
    return toret;
}